

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     convert_arg<short,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
               (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                *arg,char type)

{
  ushort uVar1;
  type tVar2;
  uint uVar3;
  ulong uVar4;
  
  switch(arg->type_) {
  case int_type:
  case uint_type:
    uVar1 = *(ushort *)&(arg->value_).field_0;
    uVar3 = (uint)uVar1;
    if ((type == 'i') || (type == 'd')) {
      uVar3 = (uint)(short)uVar1;
      tVar2 = int_type;
    }
    else {
      tVar2 = uint_type;
    }
    uVar4 = (ulong)uVar3;
    break;
  case long_long_type:
  case ulong_long_type:
    uVar4 = (arg->value_).field_0.ulong_long_value;
    if ((type == 'i') || (type == 'd')) {
      uVar4 = (ulong)(uint)(int)(short)uVar4;
      tVar2 = int_type;
    }
    else {
      uVar4 = uVar4 & 0xffff;
      tVar2 = uint_type;
    }
    break;
  case bool_type:
    if (type == 's') {
      return;
    }
    uVar4 = (ulong)((arg->value_).field_0.int_value != 0);
    tVar2 = (type == 'd' || type == 'i') ^ uint_type;
    break;
  case char_type:
    uVar3 = 0xffffffff;
    tVar2 = int_type;
    if ((type != 'd') && (type != 'i')) {
      tVar2 = uint_type;
      uVar3 = 0xffff;
    }
    uVar4 = (ulong)((int)(char)(arg->value_).field_0.int_value & uVar3);
    break;
  default:
    goto switchD_0013358b_default;
  }
  *(ulong *)&(arg->value_).field_0 = uVar4;
  arg->type_ = tVar2;
switchD_0013358b_default:
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}